

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O2

void matd_scale_inplace(matd_t *a,double s)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int i;
  uint uVar5;
  ulong uVar6;
  
  if (a == (matd_t *)0x0) {
    __assert_fail("a != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x114,"void matd_scale_inplace(matd_t *, double)");
  }
  uVar1 = a->nrows;
  uVar2 = a->ncols;
  if (uVar1 < 2 && (ulong)uVar2 < 2) {
    a[1] = (matd_t)(s * (double)a[1]);
  }
  else {
    uVar4 = 0;
    for (uVar5 = 0; uVar6 = (ulong)uVar2, uVar3 = uVar4, uVar5 != uVar1; uVar5 = uVar5 + 1) {
      while( true ) {
        if (uVar6 == 0) break;
        a[(ulong)uVar3 + 1] = (matd_t)((double)a[(ulong)uVar3 + 1] * s);
        uVar6 = uVar6 - 1;
        uVar3 = uVar3 + 1;
      }
      uVar4 = uVar4 + uVar2;
    }
  }
  return;
}

Assistant:

void matd_scale_inplace(matd_t *a, double s)
{
    assert(a != NULL);

    if (matd_is_scalar(a)) {
        a->data[0] *= s;
        return;
    }

    for (int i = 0; i < a->nrows; i++) {
        for (int j = 0; j < a->ncols; j++) {
            MATD_EL(a, i, j) *= s;
        }
    }
}